

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

unqlite_value * unqlite_vm_extract_variable(unqlite_vm *pVm,char *zVarname)

{
  char *pcVar1;
  unqlite_value *puVar2;
  char *pcVar3;
  SyString sVariable;
  SyString local_10;
  
  if ((pVm == (unqlite_vm *)0x0) || (pVm->nMagic == 0xdead2bad)) {
    return (unqlite_value *)0x0;
  }
  pcVar3 = zVarname;
  if (*zVarname != '\0') {
    pcVar1 = zVarname + 2;
    do {
      pcVar3 = pcVar1;
      if (pcVar3[-1] == '\0') {
        pcVar3 = pcVar3 + -1;
        goto LAB_0010c6c8;
      }
      if (*pcVar3 == '\0') goto LAB_0010c6c8;
      if (pcVar3[1] == '\0') {
        pcVar3 = pcVar3 + 1;
        goto LAB_0010c6c8;
      }
      pcVar1 = pcVar3 + 4;
    } while (pcVar3[2] != '\0');
    pcVar3 = pcVar3 + 2;
  }
LAB_0010c6c8:
  local_10.nByte = (int)pcVar3 - (int)zVarname;
  if (pVm->pJx9Vm->nMagic == 0xcdfe1dad) {
    local_10.zString = zVarname;
    puVar2 = VmExtractMemObj(pVm->pJx9Vm,&local_10,0,0);
  }
  else {
    puVar2 = (unqlite_value *)0x0;
  }
  return puVar2;
}

Assistant:

unqlite_value * unqlite_vm_extract_variable(unqlite_vm *pVm,const char *zVarname)
{
	unqlite_value *pValue;
	SyString sVariable;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return 0;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return 0; /* Another thread have released this instance */
	 }
#endif
	 /* Extract the target variable */
	SyStringInitFromBuf(&sVariable,zVarname,SyStrlen(zVarname));
	pValue = jx9VmExtractVariable(pVm->pJx9Vm,&sVariable);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return pValue;
}